

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void prvTidyParseRow(TidyDocImpl *doc,Node *row,GetTokenMode mode)

{
  Lexer *pLVar1;
  Bool BVar2;
  TidyTagId TVar3;
  Node *node;
  Dict *pDVar4;
  uint code;
  Node **ppNVar5;
  Node *extraout_RDX;
  Node *extraout_RDX_00;
  Node *pNVar6;
  TidyTagId tid;
  
  if ((row->tag->model & 1) != 0) {
    return;
  }
  pLVar1 = doc->lexer;
LAB_00127ff5:
  node = prvTidyGetToken(doc,IgnoreWhitespace);
  if (node == (Node *)0x0) {
    return;
  }
  if (node->tag == row->tag) {
    if (node->type == EndTag) {
      prvTidyFreeNode(doc,node);
      row->closed = yes;
    }
    else {
      prvTidyUngetToken(doc);
    }
    FixEmptyRow(doc,row);
    return;
  }
  if (node->type != EndTag) goto LAB_001280b3;
  BVar2 = prvTidynodeHasCM(node,0x82);
  pDVar4 = node->tag;
  if (BVar2 == no) {
    if (pDVar4 == (Dict *)0x0) goto LAB_00128079;
    TVar3 = pDVar4->id;
    tid = TidyTag_TABLE;
    if (TVar3 == TidyTag_TABLE) goto LAB_0012805c;
LAB_00128074:
    if (TVar3 != TidyTag_FORM) goto LAB_00128079;
LAB_00128091:
    if (pDVar4->id == TidyTag_FORM) {
      *(byte *)&doc->badForm = (byte)doc->badForm | 1;
    }
  }
  else {
    if (pDVar4 == (Dict *)0x0) {
      pDVar4 = (Dict *)0x0;
      tid = TidyTag_UNKNOWN;
    }
    else {
      tid = pDVar4->id;
    }
LAB_0012805c:
    BVar2 = DescendantOf(row,tid);
    if (BVar2 != no) goto LAB_001282d2;
    if (pDVar4 != (Dict *)0x0) {
      TVar3 = pDVar4->id;
      goto LAB_00128074;
    }
LAB_00128079:
    BVar2 = prvTidynodeHasCM(node,0x18);
    pDVar4 = node->tag;
    if (BVar2 == no) {
      if ((pDVar4 == (Dict *)0x0) || ((pDVar4->id != TidyTag_TH && (pDVar4->id != TidyTag_TD))))
      goto LAB_001280b3;
    }
    else if (pDVar4 != (Dict *)0x0) goto LAB_00128091;
  }
  goto LAB_001280fc;
LAB_001280b3:
  BVar2 = InsertMisc(row,node);
  if (BVar2 != no) goto LAB_00127ff5;
  if (node->tag == (Dict *)0x0) {
    if (node->type == TextNode) goto LAB_001280df;
  }
  else if (node->tag->id != TidyTag_TABLE) {
LAB_001280df:
    BVar2 = prvTidynodeHasCM(node,0x100);
    if (BVar2 != no) {
LAB_001282d2:
      prvTidyUngetToken(doc);
      return;
    }
    if (node->type != EndTag) {
      if ((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_FORM)) {
        BVar2 = prvTidynodeIsText(node);
        pNVar6 = extraout_RDX;
        if ((BVar2 != no) ||
           (BVar2 = prvTidynodeHasCM(node,0x18), pNVar6 = extraout_RDX_00, BVar2 != no)) {
          MoveBeforeTable((TidyDocImpl *)row,node,pNVar6);
          prvTidyReportError(doc,row,node,0xd3);
          BVar2 = pLVar1->excludeBlocks;
          pLVar1->excludeBlocks = no;
          pLVar1->exiled = yes;
          if (node->type != TextNode) {
            ParseTag(doc,node,IgnoreWhitespace);
          }
          pLVar1->exiled = no;
          pLVar1->excludeBlocks = BVar2;
          goto LAB_00127ff5;
        }
        pDVar4 = node->tag;
        if ((pDVar4->model & 4) != 0) {
          prvTidyReportError(doc,row,node,0xd3);
          MoveToHead(doc,row,node);
          goto LAB_00127ff5;
        }
LAB_001281f0:
        if ((pDVar4->id == TidyTag_TD) || (pDVar4->id == TidyTag_TH)) {
          node->parent = row;
          pNVar6 = row->last;
          node->prev = pNVar6;
          ppNVar5 = &pNVar6->next;
          if (pNVar6 == (Node *)0x0) {
            ppNVar5 = &row->content;
          }
          *ppNVar5 = node;
          row->last = node;
          BVar2 = pLVar1->excludeBlocks;
          pLVar1->excludeBlocks = no;
          ParseTag(doc,node,IgnoreWhitespace);
          pLVar1->excludeBlocks = BVar2;
          while (pLVar1->istackbase < pLVar1->istacksize) {
            prvTidyPopInline(doc,(Node *)0x0);
          }
          goto LAB_00127ff5;
        }
      }
      else {
        prvTidyUngetToken(doc);
        node = prvTidyInferredTag(doc,TidyTag_TD);
        prvTidyReportError(doc,row,node,0xd4);
        if (node == (Node *)0x0) {
          node = (Node *)0x0;
        }
        else {
          pDVar4 = node->tag;
          if (pDVar4 != (Dict *)0x0) goto LAB_001281f0;
        }
      }
      code = 0xd3;
      goto LAB_0012810a;
    }
  }
LAB_001280fc:
  code = 0xd0;
LAB_0012810a:
  prvTidyReportError(doc,row,node,code);
  prvTidyFreeNode(doc,node);
  goto LAB_00127ff5;
}

Assistant:

void TY_(ParseRow)(TidyDocImpl* doc, Node *row, GetTokenMode ARG_UNUSED(mode))
{
    Lexer* lexer = doc->lexer;
    Node *node;
    Bool exclude_state;

    if (row->tag->model & CM_EMPTY)
        return;

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == row->tag)
        {
            if (node->type == EndTag)
            {
                TY_(FreeNode)( doc, node);
                row->closed = yes;
                FixEmptyRow( doc, row);
                return;
            }

            /* New row start implies end of current row */
            TY_(UngetToken)( doc );
            FixEmptyRow( doc, row);
            return;
        }

        /* 
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if ( node->type == EndTag )
        {
            if ( (TY_(nodeHasCM)(node, CM_HTML|CM_TABLE) || nodeIsTABLE(node))
                 && DescendantOf(row, TagId(node)) )
            {
                TY_(UngetToken)( doc );
                return;
            }

            if ( nodeIsFORM(node) || TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
            {
                if ( nodeIsFORM(node) )
                    BadForm( doc );

                TY_(ReportError)(doc, row, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            if ( nodeIsTD(node) || nodeIsTH(node) )
            {
                TY_(ReportError)(doc, row, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }
        }

        /* deal with comments etc. */
        if (InsertMisc(row, node))
            continue;

        /* discard unknown tags */
        if (node->tag == NULL && node->type != TextNode)
        {
            TY_(ReportError)(doc, row, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* discard unexpected <table> element */
        if ( nodeIsTABLE(node) )
        {
            TY_(ReportError)(doc, row, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* THEAD, TFOOT or TBODY */
        if ( TY_(nodeHasCM)(node, CM_ROWGRP) )
        {
            TY_(UngetToken)( doc );
            return;
        }

        if (node->type == EndTag)
        {
            TY_(ReportError)(doc, row, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /*
          if text or inline or block move before table
          if head content move to head
        */

        if (node->type != EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_TD);
                TY_(ReportError)(doc, row, node, MISSING_STARTTAG);
            }
            else if ( TY_(nodeIsText)(node)
                      || TY_(nodeHasCM)(node, CM_BLOCK | CM_INLINE) )
            {
                MoveBeforeTable( doc, row, node );
                TY_(ReportError)(doc, row, node, TAG_NOT_ALLOWED_IN);
                lexer->exiled = yes;
                exclude_state = lexer->excludeBlocks;
                lexer->excludeBlocks = no;

                if (node->type != TextNode)
                    ParseTag( doc, node, IgnoreWhitespace);

                lexer->exiled = no;
                lexer->excludeBlocks = exclude_state;
                continue;
            }
            else if (node->tag->model & CM_HEAD)
            {
                TY_(ReportError)(doc, row, node, TAG_NOT_ALLOWED_IN);
                MoveToHead( doc, row, node);
                continue;
            }
        }

        if ( !(nodeIsTD(node) || nodeIsTH(node)) )
        {
            TY_(ReportError)(doc, row, node, TAG_NOT_ALLOWED_IN);
            TY_(FreeNode)( doc, node);
            continue;
        }
        
        /* node should be <TD> or <TH> */
        TY_(InsertNodeAtEnd)(row, node);
        exclude_state = lexer->excludeBlocks;
        lexer->excludeBlocks = no;
        ParseTag( doc, node, IgnoreWhitespace);
        lexer->excludeBlocks = exclude_state;

        /* pop inline stack */

        while ( lexer->istacksize > lexer->istackbase )
            TY_(PopInline)( doc, NULL );
    }

}